

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taiwncal.cpp
# Opt level: O3

int32_t __thiscall icu_63::TaiwanCalendar::handleGetExtendedYear(TaiwanCalendar *this)

{
  int iVar1;
  UCalendarDateFields UVar2;
  int32_t iVar3;
  int32_t iVar4;
  
  UVar2 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  if ((UVar2 == UCAL_EXTENDED_YEAR) &&
     (UVar2 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_ERA),
     UVar2 == UCAL_EXTENDED_YEAR)) {
    if (0 < (this->super_GregorianCalendar).super_Calendar.fStamp[0x13]) {
      return (this->super_GregorianCalendar).super_Calendar.fFields[0x13];
    }
    return 0x7b2;
  }
  if (0 < (this->super_GregorianCalendar).super_Calendar.fStamp[0]) {
    iVar1 = (this->super_GregorianCalendar).super_Calendar.fFields[0];
    if (iVar1 == 0) {
      iVar4 = 0x778 - (this->super_GregorianCalendar).super_Calendar.fFields[1];
      iVar1 = (this->super_GregorianCalendar).super_Calendar.fStamp[1];
      iVar3 = 0x777;
      goto LAB_0020222a;
    }
    if (iVar1 != 1) {
      return 0x7b2;
    }
  }
  iVar4 = (this->super_GregorianCalendar).super_Calendar.fFields[1] + 0x777;
  iVar1 = (this->super_GregorianCalendar).super_Calendar.fStamp[1];
  iVar3 = 0x778;
LAB_0020222a:
  if (0 < iVar1) {
    iVar3 = iVar4;
  }
  return iVar3;
}

Assistant:

int32_t TaiwanCalendar::handleGetExtendedYear()
{
    // EXTENDED_YEAR in TaiwanCalendar is a Gregorian year
    // The default value of EXTENDED_YEAR is 1970 (Minguo 59)
    int32_t year = kGregorianEpoch;

    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR
        && newerField(UCAL_EXTENDED_YEAR, UCAL_ERA) == UCAL_EXTENDED_YEAR) {
        year = internalGet(UCAL_EXTENDED_YEAR, kGregorianEpoch);
    } else {
        int32_t era = internalGet(UCAL_ERA, MINGUO);
        if(era == MINGUO) {
            year =     internalGet(UCAL_YEAR, 1) + kTaiwanEraStart;
        } else if(era == BEFORE_MINGUO) {
            year = 1 - internalGet(UCAL_YEAR, 1) + kTaiwanEraStart;
        }
    }
    return year;
}